

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall cmCTestMultiProcessHandler::PrintTestList(cmCTestMultiProcessHandler *this)

{
  uint uVar1;
  cmCTestTestHandler *pcVar2;
  cmCTestTestProperties *pcVar3;
  cmCTest *pcVar4;
  pointer pbVar5;
  char cVar6;
  _Rb_tree_node_base *p_Var7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  long lVar10;
  _Rb_tree_color _Var11;
  pointer pbVar12;
  ostringstream cmCTestLog_msg_5;
  cmWorkingDirectory workdir;
  ostringstream indexStr;
  cmCTestRunTest testRun;
  long *local_5d0;
  long local_5c8;
  long local_5c0 [2];
  _Base_ptr local_5b0;
  _Base_ptr local_5a8;
  long *local_5a0 [2];
  long local_590 [12];
  ios_base local_530 [264];
  cmWorkingDirectory local_428;
  long *local_408 [2];
  long local_3f8 [12];
  ios_base local_398 [264];
  undefined1 local_290 [440];
  int local_d8;
  
  pcVar2 = this->TestHandler;
  _Var11 = _S_red;
  for (p_Var7 = (this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 !=
      &(this->Tests).
       super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    if ((int)_Var11 < (int)p_Var7[1]._M_color) {
      _Var11 = p_Var7[1]._M_color;
    }
  }
  pcVar2->MaxIndex = _Var11;
  p_Var9 = (this->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_5b0 = &(this->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var9 != local_5b0) {
    do {
      pcVar3 = (cmCTestTestProperties *)p_Var9[1]._M_parent;
      cmWorkingDirectory::cmWorkingDirectory(&local_428,&pcVar3->Directory);
      cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)local_290,this->TestHandler);
      local_d8 = pcVar3->Index;
      local_290._0_8_ = pcVar3;
      cmCTestRunTest::ComputeArguments((cmCTestRunTest *)local_290);
      if ((pcVar3->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pcVar3->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_408,"Labels:",7);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x2b9,(char *)local_5a0[0],this->Quiet);
        if (local_5a0[0] != local_590) {
          operator_delete(local_5a0[0],local_590[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
        std::ios_base::~ios_base(local_398);
      }
      local_5a8 = p_Var9;
      for (pbVar12 = (pcVar3->Labels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 = (pcVar3->Labels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pbVar12 != pbVar5;
          pbVar12 = pbVar12 + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_408," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_408,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x2be,(char *)local_5a0[0],this->Quiet);
        if (local_5a0[0] != local_590) {
          operator_delete(local_5a0[0],local_590[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
        std::ios_base::~ios_base(local_398);
      }
      if ((pcVar3->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != pbVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
        cVar6 = (char)(ostringstream *)local_408;
        std::ios::widen((char)local_408[0][-3] + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x2c3,(char *)local_5a0[0],this->Quiet);
        if (local_5a0[0] != local_590) {
          operator_delete(local_5a0[0],local_590[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
        std::ios_base::~ios_base(local_398);
      }
      if (this->TestHandler->MemCheck == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_408,"  Memory Check",0xe);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x2c8,(char *)local_5a0[0],this->Quiet);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_408,"  Test",6);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x2ca,(char *)local_5a0[0],this->Quiet);
      }
      if (local_5a0[0] != local_590) {
        operator_delete(local_5a0[0],local_590[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
      std::ios_base::~ios_base(local_398);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_408," #",2);
      poVar8 = (ostream *)std::ostream::operator<<((ostringstream *)local_408,pcVar3->Index);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
      uVar1 = this->TestHandler->MaxIndex;
      lVar10 = 5 - (ulong)(uVar1 < 10);
      if (99 < uVar1) {
        lVar10 = 6;
      }
      *(long *)((long)local_590 + local_5a0[0][-3]) = lVar10;
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5a0,(char *)local_5d0,local_5c8);
      if (local_5d0 != local_5c0) {
        operator_delete(local_5d0,local_5c0[0] + 1);
      }
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x2d2,(char *)local_5d0,this->Quiet);
      if (local_5d0 != local_5c0) {
        operator_delete(local_5d0,local_5c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
      std::ios_base::~ios_base(local_530);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5a0," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5a0,(pcVar3->Name)._M_dataplus._M_p,
                 (long)(pcVar3->Name)._M_string_length);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x2d4,(char *)local_5d0,this->Quiet);
      if (local_5d0 != local_5c0) {
        operator_delete(local_5d0,local_5c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
      std::ios_base::~ios_base(local_530);
      if (pcVar3->Disabled == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5a0," (Disabled)",0xb);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x2d7,(char *)local_5d0,this->Quiet);
        if (local_5d0 != local_5c0) {
          operator_delete(local_5d0,local_5c0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
        std::ios_base::~ios_base(local_530);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
      cVar6 = (char)(ostringstream *)local_5a0;
      std::ios::widen((char)local_5a0[0][-3] + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x2d9,(char *)local_5d0,this->Quiet);
      if (local_5d0 != local_5c0) {
        operator_delete(local_5d0,local_5c0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
      std::ios_base::~ios_base(local_530);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
      std::ios_base::~ios_base(local_398);
      cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)local_290);
      cmWorkingDirectory::~cmWorkingDirectory(&local_428);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(local_5a8);
    } while (p_Var9 != local_5b0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
  std::ios::widen((char)(ostringstream *)local_290 +
                  (char)(((cmCTestTestProperties *)(local_290._0_8_ + -0x288))->
                        RequireSuccessDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
  ;
  std::ostream::put((char)local_290);
  poVar8 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Total Tests: ",0xd);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar4 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x2de,(char *)local_408[0],this->Quiet);
  if (local_408[0] != local_3f8) {
    operator_delete(local_408[0],local_3f8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
  std::ios_base::~ios_base((ios_base *)(local_290 + 0x70));
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintTestList()
{
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());
  int count = 0;

  for (PropertiesMap::iterator it = this->Properties.begin();
       it != this->Properties.end(); ++it) {
    count++;
    cmCTestTestHandler::cmCTestTestProperties& p = *it->second;

    cmWorkingDirectory workdir(p.Directory);

    cmCTestRunTest testRun(this->TestHandler);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments(); // logs the command in verbose mode

    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Labels:",
                         this->Quiet);
    }
    for (std::vector<std::string>::iterator label = p.Labels.begin();
         label != p.Labels.end(); ++label) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, " " << *label,
                         this->Quiet);
    }
    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                         this->Quiet);
    }

    if (this->TestHandler->MemCheck) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Memory Check",
                         this->Quiet);
    } else {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Test", this->Quiet);
    }
    std::ostringstream indexStr;
    indexStr << " #" << p.Index << ":";
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
        << indexStr.str(),
      this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " " << p.Name,
                       this->Quiet);
    if (p.Disabled) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " (Disabled)",
                         this->Quiet);
    }
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl, this->Quiet);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl
                       << "Total Tests: " << this->Total << std::endl,
                     this->Quiet);
}